

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopengltexture.cpp
# Opt level: O0

int __thiscall
QOpenGLTexturePrivate::bind(QOpenGLTexturePrivate *this,int __fd,sockaddr *__addr,socklen_t __len)

{
  long lVar1;
  int iVar2;
  long in_FS_OFFSET;
  GLint oldTextureUnit;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  iVar2 = (int)__addr;
  if (iVar2 == 0) {
    QOpenGLFunctions::glGetIntegerv
              ((QOpenGLFunctions *)((ulong)(uint)__fd << 0x20),(GLenum)((ulong)this >> 0x20),
               (GLint *)0x186f15);
  }
  QOpenGLTextureHelper::glActiveTexture
            ((QOpenGLTextureHelper *)CONCAT44(__fd,iVar2),(GLenum)((ulong)this >> 0x20));
  QOpenGLFunctions::glBindTexture
            ((QOpenGLFunctions *)CONCAT44(__fd,iVar2),(GLenum)((ulong)this >> 0x20),(GLuint)this);
  if (iVar2 == 0) {
    QOpenGLTextureHelper::glActiveTexture
              ((QOpenGLTextureHelper *)((ulong)(uint)__fd << 0x20),(GLenum)((ulong)this >> 0x20));
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QOpenGLTexturePrivate::bind(uint unit, QOpenGLTexture::TextureUnitReset reset)
{
    GLint oldTextureUnit = 0;
    if (reset == QOpenGLTexture::ResetTextureUnit)
        functions->glGetIntegerv(GL_ACTIVE_TEXTURE, &oldTextureUnit);

    texFuncs->glActiveTexture(GL_TEXTURE0 + unit);
    functions->glBindTexture(target, textureId);

    if (reset == QOpenGLTexture::ResetTextureUnit)
        texFuncs->glActiveTexture(GL_TEXTURE0 + oldTextureUnit);
}